

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

void __thiscall
TPathFragmentTable::CopyPathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  bool bVar1;
  char *pcVar2;
  TGenericArray<char> *this_00;
  
  this_00 = &pSearch->pStruct40->PathBuffer;
  if ((this->PathMarks).TotalItemCount == 0) {
    while( true ) {
      pcVar2 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      if (*pcVar2 == '\0') break;
      pcVar2 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      TGenericArray<char>::Insert(this_00,*pcVar2);
      nFragmentOffset = nFragmentOffset + 1;
    }
  }
  else {
    while( true ) {
      bVar1 = TSparseArray::IsItemPresent(&this->PathMarks,nFragmentOffset);
      if (bVar1) break;
      pcVar2 = TGenericArray<char>::operator[](&this->PathFragments,nFragmentOffset);
      TGenericArray<char>::Insert(this_00,*pcVar2);
      nFragmentOffset = nFragmentOffset + 1;
    }
  }
  return;
}

Assistant:

void CopyPathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if (PathMarks.IsEmpty())
        {
            // HOTS: 195A40C
            while (PathFragments[nFragmentOffset] != 0)
            {
                // Insert the character to the path being built
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }
        else
        {
            // HOTS: 195A4B3
            while(!PathMarks.IsItemPresent(nFragmentOffset))
            {
                // Insert the character to the path being built
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }
    }